

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

mspace create_mspace(size_t capacity,int locked)

{
  size_t sVar1;
  char *tbase;
  mstate pmVar2;
  ulong __len;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (capacity < -mparams.page_size - 0x400) {
    sVar1 = capacity + 0x400;
    if (capacity == 0) {
      sVar1 = mparams.granularity;
    }
    __len = -mparams.granularity & (mparams.granularity - 1) + sVar1;
    pmVar2 = (mstate)0x0;
    tbase = (char *)mmap((void *)0x0,__len,3,0x22,-1,0);
    if (tbase != (char *)0xffffffffffffffff) {
      pmVar2 = init_user_mstate(tbase,__len);
      (pmVar2->seg).sflags = 1;
    }
  }
  else {
    pmVar2 = (mstate)0x0;
  }
  return pmVar2;
}

Assistant:

mspace create_mspace(size_t capacity, int locked) {
  mstate m = 0;
  size_t msize;
  ensure_initialization();
  msize = pad_request(sizeof(struct malloc_state));
  if (capacity < (size_t) -(msize + TOP_FOOT_SIZE + mparams.page_size)) {
    size_t rs = ((capacity == 0)? mparams.granularity :
                 (capacity + TOP_FOOT_SIZE + msize));
    size_t tsize = granularity_align(rs);
    char* tbase = (char*)(CALL_MMAP(tsize));
    if (tbase != CMFAIL) {
      m = init_user_mstate(tbase, tsize);
      m->seg.sflags = USE_MMAP_BIT;
      set_lock(m, locked);
    }
  }
  return (mspace)m;
}